

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O1

void __thiscall
MeCab::EncoderFeatureIndex::shrink
          (EncoderFeatureIndex *this,size_t freq,vector<double,_std::allocator<double>_> *observed)

{
  int *piVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  size_t sVar4;
  pointer pdVar5;
  pointer puVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  int *piVar12;
  long lVar13;
  int *piVar14;
  int iVar15;
  _Base_ptr p_Var16;
  long lVar17;
  _Self __tmp;
  ulong uVar18;
  const_iterator __position;
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqv;
  vector<double,_std::allocator<double>_> observed_new;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> old2new;
  allocator_type local_a9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  vector<double,_std::allocator<double>_> local_88;
  vector<double,_std::allocator<double>_> *local_70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_68;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = observed;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&local_a8,(this->super_FeatureIndex).maxid_);
  puVar6 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (p_Var7 = *(_Rb_tree_node_base **)&this->field_0x1b8;
      p_Var7 != (_Rb_tree_node_base *)&this->field_0x1a8;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    piVar12 = *(int **)(p_Var7 + 2);
    iVar15 = *piVar12;
    while (iVar15 != -1) {
      piVar12 = piVar12 + 1;
      puVar6[iVar15] = (long)&(p_Var7[2]._M_parent)->_M_color + puVar6[iVar15];
      iVar15 = *piVar12;
    }
  }
  if (1 < freq) {
    (this->super_FeatureIndex).maxid_ = 0;
    p_Var3 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar18 = 0;
      do {
        if (freq <= local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar18]) {
          sVar4 = (this->super_FeatureIndex).maxid_;
          (this->super_FeatureIndex).maxid_ = sVar4 + 1;
          local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = (int)uVar18;
          local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ = (int)sVar4;
          std::
          _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
          ::_M_emplace_unique<std::pair<int,int>>
                    ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                      *)&local_60,(pair<int,_int> *)&local_88);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < (ulong)((long)local_a8.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_a8.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    __position._M_node = (this->dic_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(this->dic_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)__position._M_node != p_Var2) {
      local_68 = &this->dic_;
      do {
        p_Var8 = &p_Var3->_M_header;
        if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            if ((int)__position._M_node[2]._M_color <= (int)*(size_t *)(p_Var10 + 1)) {
              p_Var8 = p_Var10;
            }
            p_Var10 = (&p_Var10->_M_left)
                      [(int)*(size_t *)(p_Var10 + 1) < (int)__position._M_node[2]._M_color];
          } while (p_Var10 != (_Base_ptr)0x0);
        }
        p_Var11 = p_Var3;
        if (((_Rb_tree_header *)p_Var8 != p_Var3) &&
           (p_Var11 = (_Rb_tree_header *)p_Var8,
           (int)__position._M_node[2]._M_color < (int)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
          p_Var11 = p_Var3;
        }
        if (p_Var11 == p_Var3) {
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::_M_erase_aux(&local_68->_M_t,__position);
        }
        else {
          __position._M_node[2]._M_color = *(_Rb_tree_color *)((long)&p_Var11->_M_node_count + 4);
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        }
        __position._M_node = p_Var9;
      } while ((_Rb_tree_header *)p_Var9 != p_Var2);
    }
    p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    for (p_Var7 = *(_Rb_tree_node_base **)&this->field_0x1b8;
        p_Var7 != (_Rb_tree_node_base *)&this->field_0x1a8;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      piVar12 = *(int **)(p_Var7 + 2);
      iVar15 = *piVar12;
      piVar14 = piVar12;
      while (p_Var10 = &p_Var3->_M_header, p_Var16 = p_Var8, iVar15 != -1) {
        for (; p_Var16 != (_Base_ptr)0x0;
            p_Var16 = (&p_Var16->_M_left)[(int)p_Var16[1]._M_color < iVar15]) {
          if (iVar15 <= (int)p_Var16[1]._M_color) {
            p_Var10 = p_Var16;
          }
        }
        p_Var16 = &p_Var3->_M_header;
        if (((_Rb_tree_header *)p_Var10 != p_Var3) &&
           (p_Var16 = p_Var10, iVar15 < (int)p_Var10[1]._M_color)) {
          p_Var16 = &p_Var3->_M_header;
        }
        if ((_Rb_tree_header *)p_Var16 != p_Var3) {
          *piVar12 = *(int *)&p_Var16[1].field_0x4;
          piVar12 = piVar12 + 1;
        }
        piVar1 = piVar14 + 1;
        piVar14 = piVar14 + 1;
        iVar15 = *piVar1;
      }
      *piVar12 = -1;
    }
    std::vector<double,_std::allocator<double>_>::vector
              (&local_88,(this->super_FeatureIndex).maxid_,&local_a9);
    pdVar5 = (local_70->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = (long)(local_70->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar5;
    if (lVar13 != 0) {
      lVar13 = lVar13 >> 3;
      lVar17 = 0;
      do {
        iVar15 = (int)lVar17;
        p_Var10 = &p_Var3->_M_header;
        for (p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < iVar15])
        {
          if (iVar15 <= (int)p_Var8[1]._M_color) {
            p_Var10 = p_Var8;
          }
        }
        p_Var8 = &p_Var3->_M_header;
        if (((_Rb_tree_header *)p_Var10 != p_Var3) &&
           (p_Var8 = p_Var10, iVar15 < (int)p_Var10[1]._M_color)) {
          p_Var8 = &p_Var3->_M_header;
        }
        if ((_Rb_tree_header *)p_Var8 != p_Var3) {
          *(double *)
           (CONCAT44(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     (int)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start) + (long)*(int *)&p_Var8[1].field_0x4 * 8
           ) = pdVar5[lVar17];
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != lVar13 + (ulong)(lVar13 == 0));
    }
    std::vector<double,_std::allocator<double>_>::operator=(local_70,&local_88);
    if ((void *)CONCAT44(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         (int)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_88.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_88.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start));
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_60);
  }
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void EncoderFeatureIndex::shrink(size_t freq,
                                 std::vector<double> *observed) {
  std::vector<size_t> freqv;
  // count fvector
  freqv.resize(maxid_);
  for (std::map<std::string, std::pair<const int*, size_t> >::const_iterator
           it = feature_cache_.begin();
       it != feature_cache_.end(); ++it) {
    for (const int *f = it->second.first; *f != -1; ++f) {
      freqv[*f] += it->second.second;  // freq
    }
  }

  if (freq <= 1) {
    return;
  }

  // make old2new map
  maxid_ = 0;
  std::map<int, int> old2new;
  for (size_t i = 0; i < freqv.size(); ++i) {
    if (freqv[i] >= freq) {
      old2new.insert(std::pair<int, int>(i, maxid_++));
    }
  }

  // update dic_
  for (std::map<std::string, int>::iterator
           it = dic_.begin(); it != dic_.end();) {
    std::map<int, int>::const_iterator it2 = old2new.find(it->second);
    if (it2 != old2new.end()) {
      it->second = it2->second;
      ++it;
    } else {
      dic_.erase(it++);
    }
  }

  // update all fvector
  for (std::map<std::string, std::pair<const int*, size_t> >::const_iterator
           it = feature_cache_.begin(); it != feature_cache_.end(); ++it) {
    int *to = const_cast<int *>(it->second.first);
    for (const int *f = it->second.first; *f != -1; ++f) {
      std::map<int, int>::const_iterator it2 = old2new.find(*f);
      if (it2 != old2new.end()) {
        *to = it2->second;
        ++to;
      }
    }
    *to = -1;
  }

  // update observed vector
  std::vector<double> observed_new(maxid_);
  for (size_t i = 0; i < observed->size(); ++i) {
    std::map<int, int>::const_iterator it = old2new.find(static_cast<int>(i));
    if (it != old2new.end()) {
      observed_new[it->second] = (*observed)[i];
    }
  }

  // copy
  *observed = observed_new;

  return;
}